

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  bool bVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  p_Var2 = &(this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left; (_Rb_tree_header *)p_Var3 != p_Var2;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = IsSatisfied(*(ExpectationBase **)(p_Var3 + 1));
    if (!bVar1) break;
    bVar1 = AllPrerequisitesAreSatisfied(*(ExpectationBase **)(p_Var3 + 1));
    if (!bVar1) break;
  }
  return (_Rb_tree_header *)p_Var3 == p_Var2;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (!(it->expectation_base()->IsSatisfied()) ||
        !(it->expectation_base()->AllPrerequisitesAreSatisfied()))
      return false;
  }
  return true;
}